

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O2

void __thiscall
glslang::TParseVersions::requireNotRemoved
          (TParseVersions *this,TSourceLoc *loc,int profileMask,int removedVersion,char *featureDesc
          )

{
  char *pcVar1;
  char buf [60];
  
  if (((this->profile & profileMask) != EBadProfile) && (removedVersion <= this->version)) {
    pcVar1 = ProfileName(this->profile);
    snprintf(buf,0x3c,"%s profile; removed in version %d",pcVar1,(ulong)(uint)removedVersion);
    (*this->_vptr_TParseVersions[0x2d])(this,loc,"no longer supported in",featureDesc,buf);
  }
  return;
}

Assistant:

void TParseVersions::requireNotRemoved(const TSourceLoc& loc, int profileMask, int removedVersion, const char* featureDesc)
{
    if (profile & profileMask) {
        if (version >= removedVersion) {
            const int maxSize = 60;
            char buf[maxSize];
            snprintf(buf, maxSize, "%s profile; removed in version %d", ProfileName(profile), removedVersion);
            error(loc, "no longer supported in", featureDesc, buf);
        }
    }
}